

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O2

void __thiscall DImpactDecal::DImpactDecal(DImpactDecal *this,double z)

{
  DBaseDecal::DBaseDecal(&this->super_DBaseDecal,2,z);
  (this->super_DBaseDecal).super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00700028;
  ImpactCount = ImpactCount + 1;
  return;
}

Assistant:

DImpactDecal::DImpactDecal (double z)
: DBaseDecal (STAT_AUTODECAL, z)
{
	ImpactCount++;
}